

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

int notRecursiveDetectTest(char *filename,char *result,char *err,int options)

{
  xmlParserCtxtPtr ctxt_00;
  long lVar1;
  undefined4 local_48;
  int parserOptions;
  int res;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr doc;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  local_48 = 4;
  nb_tests = nb_tests + 1;
  ctxt_00 = (xmlParserCtxtPtr)xmlNewParserCtxt();
  if ((options & 1U) != 0) {
    initSAX(ctxt_00);
  }
  if ((options & 2U) == 0) {
    local_48 = 6;
  }
  lVar1 = xmlCtxtReadFile(ctxt_00,filename,0,local_48);
  if (lVar1 != 0) {
    xmlFreeDoc(lVar1);
    xmlFreeParserCtxt(ctxt_00);
  }
  else {
    fprintf(_stderr,"Failed to parse correct file %s\n",filename);
    xmlFreeParserCtxt(ctxt_00);
  }
  filename_local._4_4_ = (uint)(lVar1 == 0);
  return filename_local._4_4_;
}

Assistant:

static int
notRecursiveDetectTest(const char *filename,
             const char *result ATTRIBUTE_UNUSED,
             const char *err ATTRIBUTE_UNUSED,
	     int options) {
    xmlDocPtr doc;
    xmlParserCtxtPtr ctxt;
    int res = 0;
    int parserOptions = XML_PARSE_DTDLOAD;

    nb_tests++;

    ctxt = xmlNewParserCtxt();
    if (options & OPT_SAX)
        initSAX(ctxt);
    if ((options & OPT_NO_SUBST) == 0)
        parserOptions |= XML_PARSE_NOENT;
    /*
     * base of the test, parse with the old API
     */
    doc = xmlCtxtReadFile(ctxt, filename, NULL, parserOptions);
    if (doc == NULL) {
        fprintf(stderr, "Failed to parse correct file %s\n", filename);
	xmlFreeParserCtxt(ctxt);
        return(1);
    }
    xmlFreeDoc(doc);
    xmlFreeParserCtxt(ctxt);

    return(res);
}